

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall
testing::internal::FunctionMockerBase<void_(mp::obj::Type)>::~FunctionMockerBase
          (FunctionMockerBase<void_(mp::obj::Type)> *this)

{
  UntypedFunctionMockerBase *unaff_RBX;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002f4380;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(unaff_RBX);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  MutexBase::Unlock((MutexBase *)g_gmock_mutex);
  (this->current_spec_).matchers_.super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
  super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl.
  super_MatcherBase<mp::obj::Type>._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_002f2db8;
  linked_ptr<const_testing::MatcherInterface<mp::obj::Type>_>::~linked_ptr
            (&(this->current_spec_).matchers_.
              super__Tuple_impl<0UL,_testing::Matcher<mp::obj::Type>_>.
              super__Head_base<0UL,_testing::Matcher<mp::obj::Type>,_false>._M_head_impl.
              super_MatcherBase<mp::obj::Type>.impl_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }